

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_arm_shift_reg(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,int shiftop,TCGv_i32 shift,
                      int flags)

{
  TCGv_i32 pTVar1;
  uintptr_t o_1;
  uintptr_t o_11;
  TCGv_i32 pTVar2;
  TCGOpcode opc;
  code *func;
  uintptr_t o_8;
  uintptr_t o_10;
  TCGv_i32 pTVar3;
  uintptr_t o;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i32 local_38;
  
  if (flags != 0) {
    switch(shiftop) {
    case 0:
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_shl_cc_aarch64;
      break;
    case 1:
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_shr_cc_aarch64;
      break;
    case 2:
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_sar_cc_aarch64;
      break;
    case 3:
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_ror_cc_aarch64;
      break;
    default:
      goto switchD_0065c7d8_default;
    }
    local_38 = shift + (long)&tcg_ctx->pool_cur;
    local_40 = (TCGTemp *)(var + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,func,local_40,3,&local_48);
    goto switchD_0065c7d8_default;
  }
  switch(shiftop) {
  case 0:
    local_50 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    pTVar2 = (TCGv_i32)((long)local_50 - (long)tcg_ctx);
    tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar2,shift,0xff);
    pTVar3 = tcg_const_i32_aarch64(tcg_ctx,0);
    pTVar1 = tcg_const_i32_aarch64(tcg_ctx,0x1f);
    tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_GTU,pTVar3,pTVar2,pTVar1,pTVar3,var);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar2,pTVar2,0x1f);
    opc = INDEX_op_shl_i32;
    break;
  case 1:
    local_50 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    pTVar2 = (TCGv_i32)((long)local_50 - (long)tcg_ctx);
    tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar2,shift,0xff);
    pTVar3 = tcg_const_i32_aarch64(tcg_ctx,0);
    pTVar1 = tcg_const_i32_aarch64(tcg_ctx,0x1f);
    tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_GTU,pTVar3,pTVar2,pTVar1,pTVar3,var);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar2,pTVar2,0x1f);
    opc = INDEX_op_shr_i32;
    break;
  case 2:
    local_50 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)local_50 - (long)tcg_ctx);
    tcg_gen_andi_i32_aarch64(tcg_ctx,pTVar3,shift,0xff);
    pTVar1 = tcg_const_i32_aarch64(tcg_ctx,0x1f);
    tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_GTU,pTVar3,pTVar3,pTVar1,pTVar1,pTVar3);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_sar_i32,(TCGArg)(var + (long)tcg_ctx),
                        (TCGArg)(var + (long)tcg_ctx),(TCGArg)local_50);
    goto LAB_0065cab2;
  case 3:
    tcg_gen_andi_i32_aarch64(tcg_ctx,shift,shift,0x1f);
    tcg_gen_rotr_i32_aarch64(tcg_ctx,var,var,shift);
  default:
    goto switchD_0065c7d8_default;
  }
  tcg_gen_op3_aarch64(tcg_ctx,opc,(TCGArg)(var + (long)tcg_ctx),(TCGArg)(pTVar3 + (long)tcg_ctx),
                      (TCGArg)local_50);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
LAB_0065cab2:
  tcg_temp_free_internal_aarch64(tcg_ctx,local_50);
switchD_0065c7d8_default:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(shift + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_arm_shift_reg(TCGContext *tcg_ctx, TCGv_i32 var, int shiftop,
                                     TCGv_i32 shift, int flags)
{
    if (flags) {
        switch (shiftop) {
        case 0: gen_helper_shl_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        case 1: gen_helper_shr_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        case 2: gen_helper_sar_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        case 3: gen_helper_ror_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        }
    } else {
        switch (shiftop) {
        case 0:
            gen_shl(tcg_ctx, var, var, shift);
            break;
        case 1:
            gen_shr(tcg_ctx, var, var, shift);
            break;
        case 2:
            gen_sar(tcg_ctx, var, var, shift);
            break;
        case 3: tcg_gen_andi_i32(tcg_ctx, shift, shift, 0x1f);
                tcg_gen_rotr_i32(tcg_ctx, var, var, shift); break;
        }
    }
    tcg_temp_free_i32(tcg_ctx, shift);
}